

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMap<QString,_QMatchData>::erase
          (QMap<QString,_QMatchData> *this,const_iterator afirst,const_iterator alast)

{
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *this_00;
  EraseResult EVar1;
  
  this_00 = (this->d).d.ptr;
  if (this_00 ==
      (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
       *)0x0) {
    alast.i._M_node = (const_iterator)(_Base_ptr)0x0;
  }
  else if ((__atomic_base<int>)
           *(__int_type *)
            &(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1) {
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
    ::_M_erase_aux(&(this_00->m)._M_t,afirst.i._M_node,alast.i._M_node);
  }
  else {
    EVar1 = QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
            ::erase(this_00,afirst.i._M_node,alast.i._M_node);
    alast.i._M_node = (const_iterator)EVar1.it._M_node;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
    ::reset(&this->d,EVar1.data);
  }
  return (iterator)(iterator)alast.i._M_node;
}

Assistant:

iterator erase(const_iterator afirst, const_iterator alast)
    {
        if (!d)
            return iterator();

        if (!d.isShared())
            return iterator(d->m.erase(afirst.i, alast.i));

        auto result = d->erase(afirst.i, alast.i);
        d.reset(result.data);
        return iterator(result.it);
    }